

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ImfHeader.cpp
# Opt level: O0

void __thiscall Imf_2_5::Header::setVersion(Header *this,int version)

{
  ArgExc *this_00;
  int in_ESI;
  Attribute *in_stack_00000580;
  char *in_stack_00000588;
  Header *in_stack_00000590;
  TypedAttribute<int> *in_stack_ffffffffffffffc0;
  int local_20 [8];
  
  if (in_ESI != 1) {
    this_00 = (ArgExc *)__cxa_allocate_exception(0x48);
    Iex_2_5::ArgExc::ArgExc(this_00,"We can only process version 1");
    __cxa_throw(this_00,&Iex_2_5::ArgExc::typeinfo,Iex_2_5::ArgExc::~ArgExc);
  }
  TypedAttribute<int>::TypedAttribute(in_stack_ffffffffffffffc0,local_20);
  insert(in_stack_00000590,in_stack_00000588,in_stack_00000580);
  TypedAttribute<int>::~TypedAttribute((TypedAttribute<int> *)0x13f678);
  return;
}

Assistant:

void
Header::setVersion(const int version)
{
    if (version != 1)
    {
        throw IEX_NAMESPACE::ArgExc ("We can only process version 1");
    }

    insert ("version", IntAttribute (version));
}